

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

event * helix::make_ob_event(string *symbol,uint64_t timestamp,order_book *ob,event_mask mask)

{
  string *in_RCX;
  undefined8 in_RDX;
  event *in_RSI;
  order_book *in_RDI;
  undefined4 in_R8D;
  trade *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  event::event(in_RSI,(event_mask)((ulong)in_RDX >> 0x20),in_RCX,
               CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_RDI,in_stack_ffffffffffffffc8);
  return (event *)in_RDI;
}

Assistant:

event make_ob_event(const std::string& symbol, uint64_t timestamp, order_book* ob, event_mask mask)
{
    return event{mask | ev_order_book_update, symbol, timestamp, ob, nullptr};
}